

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O0

Nwk_Obj_t * Nwk_ManReallocNode(Nwk_Obj_t *pObj)

{
  Nwk_Obj_t **__src;
  int iVar1;
  Nwk_Obj_t **ppNVar2;
  Nwk_Obj_t **pFanioOld;
  Nwk_Obj_t *pObj_local;
  
  __src = pObj->pFanio;
  iVar1 = Nwk_ObjReallocIsNeeded(pObj);
  if (iVar1 != 0) {
    ppNVar2 = (Nwk_Obj_t **)Aig_MmFlexEntryFetch(pObj->pMan->pMemObjs,pObj->nFanioAlloc << 4);
    pObj->pFanio = ppNVar2;
    memmove(pObj->pFanio,__src,(long)pObj->nFanioAlloc << 3);
    pObj->nFanioAlloc = pObj->nFanioAlloc << 1;
    pObj->pMan->nRealloced = pObj->pMan->nRealloced + 1;
    return (Nwk_Obj_t *)0x0;
  }
  __assert_fail("Nwk_ObjReallocIsNeeded(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                ,0x92,"Nwk_Obj_t *Nwk_ManReallocNode(Nwk_Obj_t *)");
}

Assistant:

static Nwk_Obj_t * Nwk_ManReallocNode( Nwk_Obj_t * pObj )
{  
    Nwk_Obj_t ** pFanioOld = pObj->pFanio;
    assert( Nwk_ObjReallocIsNeeded(pObj) );
    pObj->pFanio = (Nwk_Obj_t **)Aig_MmFlexEntryFetch( pObj->pMan->pMemObjs, 2 * pObj->nFanioAlloc * sizeof(Nwk_Obj_t *) );
    memmove( pObj->pFanio, pFanioOld, pObj->nFanioAlloc * sizeof(Nwk_Obj_t *) );
    pObj->nFanioAlloc *= 2;
    pObj->pMan->nRealloced++;
    return NULL;
}